

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# activity_tracking.hpp
# Opt level: O1

activity_stats_t * __thiscall
so_5::stats::activity_tracking_stuff::
stats_collector_t<so_5::stats::activity_tracking_stuff::null_lock>::take_stats
          (activity_stats_t *__return_storage_ptr__,
          stats_collector_t<so_5::stats::activity_tracking_stuff::null_lock> *this)

{
  long lVar1;
  ulong uVar2;
  rep rVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  
  (__return_storage_ptr__->m_avg_time).__r = (this->m_work_activity).m_avg_time.__r;
  rVar3 = (this->m_work_activity).m_total_time.__r;
  __return_storage_ptr__->m_count = (this->m_work_activity).m_count;
  (__return_storage_ptr__->m_total_time).__r = rVar3;
  if (this->m_is_in_working == true) {
    lVar1 = (this->m_work_started_at).__d.__r;
    lVar4 = std::chrono::_V2::steady_clock::now();
    lVar4 = lVar4 - lVar1;
    (__return_storage_ptr__->m_total_time).__r = (__return_storage_ptr__->m_total_time).__r + lVar4;
    uVar2 = __return_storage_ptr__->m_count;
    iVar6 = 1;
    if (uVar2 != 0) {
      iVar6 = (int)uVar2;
    }
    iVar5 = 100;
    if (uVar2 < 0x65) {
      iVar5 = iVar6;
    }
    (__return_storage_ptr__->m_avg_time).__r =
         (lVar4 + (long)(iVar5 + -1) * (__return_storage_ptr__->m_avg_time).__r) / (long)iVar5;
  }
  return __return_storage_ptr__;
}

Assistant:

so_5::stats::activity_stats_t
		take_stats()
			{
				so_5::stats::activity_stats_t result;
				bool is_in_working{ false };
				so_5::stats::clock_type_t::time_point work_started_at;

				{
					typename LOCK_HOLDER::take_stats_lock_t lock{ lock_holder() };

					result = m_work_activity;
					if( true == (is_in_working = m_is_in_working) )
						work_started_at = m_work_started_at;
				}

				if( is_in_working )
					so_5::stats::details::update_stats_from_current_time(
							result,
							work_started_at );

				return result;
			}